

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alter_table_function_info.cpp
# Opt level: O3

void __thiscall
duckdb::AddTableFunctionOverloadInfo::~AddTableFunctionOverloadInfo
          (AddTableFunctionOverloadInfo *this)

{
  ~AddTableFunctionOverloadInfo(this);
  operator_delete(this);
  return;
}

Assistant:

AddTableFunctionOverloadInfo::~AddTableFunctionOverloadInfo() {
}